

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O0

void __thiscall OpenMD::GofRAngle::preProcess(GofRAngle *this)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *pvVar1;
  iterator __first;
  int *in_RDI;
  uint i;
  uint in_stack_ffffffffffffffd8;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    this_00 = (vector<double,_std::allocator<double>_> *)(ulong)local_c;
    pvVar1 = (vector<double,_std::allocator<double>_> *)
             std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)(in_RDI + 0x58c));
    if (pvVar1 <= this_00) break;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x58c),(ulong)local_c);
    std::vector<double,_std::allocator<double>_>::begin(this_00);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x58c),(ulong)local_c);
    __first = std::vector<double,_std::allocator<double>_>::end(this_00);
    __last._M_current._4_4_ = 0;
    __last._M_current._0_4_ = in_stack_ffffffffffffffd8;
    std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __first._M_current,__last,in_RDI);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void GofRAngle::preProcess() {
    for (unsigned int i = 0; i < avgGofr_.size(); ++i) {
      std::fill(avgGofr_[i].begin(), avgGofr_[i].end(), 0);
    }
  }